

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test::
~SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test
          (SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test *this)

{
  SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test *this_local;
  
  ~SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_missing_Quantity)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "subject is incomplete, missing: Quantity");
        return;
    }

    FAIL();
}